

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to16.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  int iVar4;
  uint _h;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int *piVar22;
  int nn;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [64];
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [64];
  ulong uVar30;
  undefined1 (*pauVar31) [64];
  undefined1 (*pauVar32) [32];
  ulong uVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float zeros [16];
  Mat local_d8;
  ulong local_88;
  void *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar24 = (ulong)(int)uVar3;
  iVar4 = bottom_im2col->h;
  _h = bottom_im2col->c;
  local_88 = (ulong)(uint)top_blob->c;
  local_80 = _bias->data;
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  iVar34 = iVar4 * 8;
  if ((long)uVar24 < 8) {
    iVar34 = iVar4;
  }
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  uVar35 = (uVar3 & 7) + (uVar3 >> 3);
  if ((long)uVar24 < 8) {
    uVar35 = uVar3;
  }
  Mat::create(&local_d8,iVar34,_h,uVar35,0x20,8,opt->workspace_allocator);
  if (0 < (int)uVar3 >> 3) {
    lVar23 = 0x80;
    uVar26 = 0;
    do {
      if (0 < (int)_h) {
        pauVar28 = (undefined1 (*) [32])
                   (local_d8.cstep * uVar26 *
                    CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
                   (long)local_d8.data);
        uVar30 = 0;
        do {
          if (0 < iVar4) {
            pauVar32 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar30 + lVar23);
            iVar34 = iVar4;
            do {
              auVar11 = vunpcklps_avx(pauVar32[-4],pauVar32[-3]);
              auVar5 = vunpckhps_avx(pauVar32[-4],pauVar32[-3]);
              auVar12 = vunpcklps_avx(pauVar32[-2],pauVar32[-1]);
              auVar6 = vunpckhps_avx(pauVar32[-2],pauVar32[-1]);
              auVar13 = vunpcklps_avx(*pauVar32,pauVar32[1]);
              auVar7 = vunpckhps_avx(*pauVar32,pauVar32[1]);
              auVar47 = vunpcklps_avx(pauVar32[2],pauVar32[3]);
              auVar8 = vunpckhps_avx(pauVar32[2],pauVar32[3]);
              auVar9 = vunpcklpd_avx(auVar11,auVar12);
              auVar11 = vunpckhpd_avx(auVar11,auVar12);
              auVar12 = vunpcklpd_avx(auVar5,auVar6);
              auVar5 = vunpckhpd_avx(auVar5,auVar6);
              auVar10 = vunpcklpd_avx(auVar13,auVar47);
              auVar6 = vunpckhpd_avx(auVar13,auVar47);
              auVar13 = vunpcklpd_avx(auVar7,auVar8);
              auVar7 = vunpckhpd_avx(auVar7,auVar8);
              auVar47._16_16_ = auVar10._0_16_;
              auVar47._0_16_ = auVar9._0_16_;
              auVar48._16_16_ = auVar6._0_16_;
              auVar48._0_16_ = auVar11._0_16_;
              auVar49._16_16_ = auVar13._0_16_;
              auVar49._0_16_ = auVar12._0_16_;
              auVar50._16_16_ = auVar7._0_16_;
              auVar50._0_16_ = auVar5._0_16_;
              auVar8 = vperm2f128_avx(auVar9,auVar10,0x31);
              auVar11 = vperm2f128_avx(auVar11,auVar6,0x31);
              auVar6 = vperm2f128_avx(auVar12,auVar13,0x31);
              auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
              *pauVar28 = auVar47;
              pauVar28[1] = auVar48;
              pauVar28[2] = auVar49;
              pauVar28[3] = auVar50;
              pauVar28[4] = auVar8;
              pauVar28[5] = auVar11;
              pauVar28[6] = auVar6;
              pauVar28[7] = auVar5;
              pauVar28 = pauVar28 + 8;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(int)(uVar3 * 8) * 4);
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != _h);
      }
      uVar26 = uVar26 + 1;
      lVar23 = lVar23 + 0x100;
    } while (uVar26 != (uint)((int)uVar3 >> 3));
  }
  uVar26 = uVar24 & 0xfffffffffffffff8;
  if ((uint)uVar26 != uVar3) {
    lVar23 = uVar26 << 5;
    do {
      if (0 < (int)_h) {
        uVar35 = (uint)uVar26;
        uVar25 = uVar35 + 7;
        if (-1 < (int)uVar35) {
          uVar25 = uVar35;
        }
        pauVar28 = (undefined1 (*) [32])
                   ((long)(int)(((int)uVar25 >> 3) + (uVar35 - (uVar25 & 0xfffffff8))) *
                    local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)
                   + (long)local_d8.data);
        uVar30 = 0;
        do {
          if (0 < iVar4) {
            pauVar32 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar30 + lVar23);
            iVar34 = iVar4;
            do {
              *pauVar28 = *pauVar32;
              pauVar28 = pauVar28 + 1;
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(int)(uVar3 * 8) * 4);
              iVar34 = iVar34 + -1;
            } while (iVar34 != 0);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != _h);
      }
      uVar26 = uVar26 + 1;
      lVar23 = lVar23 + 0x20;
    } while ((long)uVar26 < (long)uVar24);
  }
  if (0 < (int)local_88) {
    iVar34 = _h * iVar4 * 8;
    uVar26 = 0;
    do {
      pauVar27 = (undefined1 (*) [64])
                 (top_blob->cstep * uVar26 * top_blob->elemsize + (long)top_blob->data);
      pauVar29 = (undefined1 (*) [64])(uVar26 * 0x40 + (long)local_80);
      if (local_80 == (void *)0x0) {
        pauVar29 = (undefined1 (*) [64])&local_78;
      }
      local_78 = 0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar30 = 0;
      }
      else {
        lVar23 = 0;
        uVar33 = 0;
        do {
          auVar46 = *pauVar29;
          auVar45 = auVar46;
          auVar44 = auVar46;
          auVar43 = auVar46;
          auVar42 = auVar46;
          auVar41 = auVar46;
          auVar40 = auVar46;
          auVar39 = auVar46;
          if (0 < (int)(_h * iVar4 * 8)) {
            lVar36 = local_d8.cstep *
                     CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * lVar23;
            lVar37 = 0;
            iVar38 = iVar34;
            do {
              auVar2 = *(undefined1 (*) [64])
                        ((long)kernel->data + lVar37 * 2 + kernel->cstep * uVar26 * kernel->elemsize
                        );
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar39 = vfmadd231ps_avx512f(auVar39,auVar2,auVar14);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 4);
              auVar15._4_4_ = uVar1;
              auVar15._0_4_ = uVar1;
              auVar15._8_4_ = uVar1;
              auVar15._12_4_ = uVar1;
              auVar15._16_4_ = uVar1;
              auVar15._20_4_ = uVar1;
              auVar15._24_4_ = uVar1;
              auVar15._28_4_ = uVar1;
              auVar15._32_4_ = uVar1;
              auVar15._36_4_ = uVar1;
              auVar15._40_4_ = uVar1;
              auVar15._44_4_ = uVar1;
              auVar15._48_4_ = uVar1;
              auVar15._52_4_ = uVar1;
              auVar15._56_4_ = uVar1;
              auVar15._60_4_ = uVar1;
              auVar40 = vfmadd231ps_avx512f(auVar40,auVar2,auVar15);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 8);
              auVar16._4_4_ = uVar1;
              auVar16._0_4_ = uVar1;
              auVar16._8_4_ = uVar1;
              auVar16._12_4_ = uVar1;
              auVar16._16_4_ = uVar1;
              auVar16._20_4_ = uVar1;
              auVar16._24_4_ = uVar1;
              auVar16._28_4_ = uVar1;
              auVar16._32_4_ = uVar1;
              auVar16._36_4_ = uVar1;
              auVar16._40_4_ = uVar1;
              auVar16._44_4_ = uVar1;
              auVar16._48_4_ = uVar1;
              auVar16._52_4_ = uVar1;
              auVar16._56_4_ = uVar1;
              auVar16._60_4_ = uVar1;
              auVar41 = vfmadd231ps_avx512f(auVar41,auVar2,auVar16);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 0xc);
              auVar17._4_4_ = uVar1;
              auVar17._0_4_ = uVar1;
              auVar17._8_4_ = uVar1;
              auVar17._12_4_ = uVar1;
              auVar17._16_4_ = uVar1;
              auVar17._20_4_ = uVar1;
              auVar17._24_4_ = uVar1;
              auVar17._28_4_ = uVar1;
              auVar17._32_4_ = uVar1;
              auVar17._36_4_ = uVar1;
              auVar17._40_4_ = uVar1;
              auVar17._44_4_ = uVar1;
              auVar17._48_4_ = uVar1;
              auVar17._52_4_ = uVar1;
              auVar17._56_4_ = uVar1;
              auVar17._60_4_ = uVar1;
              auVar42 = vfmadd231ps_avx512f(auVar42,auVar2,auVar17);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 0x10);
              auVar18._4_4_ = uVar1;
              auVar18._0_4_ = uVar1;
              auVar18._8_4_ = uVar1;
              auVar18._12_4_ = uVar1;
              auVar18._16_4_ = uVar1;
              auVar18._20_4_ = uVar1;
              auVar18._24_4_ = uVar1;
              auVar18._28_4_ = uVar1;
              auVar18._32_4_ = uVar1;
              auVar18._36_4_ = uVar1;
              auVar18._40_4_ = uVar1;
              auVar18._44_4_ = uVar1;
              auVar18._48_4_ = uVar1;
              auVar18._52_4_ = uVar1;
              auVar18._56_4_ = uVar1;
              auVar18._60_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512f(auVar43,auVar2,auVar18);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 0x14);
              auVar19._4_4_ = uVar1;
              auVar19._0_4_ = uVar1;
              auVar19._8_4_ = uVar1;
              auVar19._12_4_ = uVar1;
              auVar19._16_4_ = uVar1;
              auVar19._20_4_ = uVar1;
              auVar19._24_4_ = uVar1;
              auVar19._28_4_ = uVar1;
              auVar19._32_4_ = uVar1;
              auVar19._36_4_ = uVar1;
              auVar19._40_4_ = uVar1;
              auVar19._44_4_ = uVar1;
              auVar19._48_4_ = uVar1;
              auVar19._52_4_ = uVar1;
              auVar19._56_4_ = uVar1;
              auVar19._60_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512f(auVar44,auVar2,auVar19);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 0x18);
              auVar20._4_4_ = uVar1;
              auVar20._0_4_ = uVar1;
              auVar20._8_4_ = uVar1;
              auVar20._12_4_ = uVar1;
              auVar20._16_4_ = uVar1;
              auVar20._20_4_ = uVar1;
              auVar20._24_4_ = uVar1;
              auVar20._28_4_ = uVar1;
              auVar20._32_4_ = uVar1;
              auVar20._36_4_ = uVar1;
              auVar20._40_4_ = uVar1;
              auVar20._44_4_ = uVar1;
              auVar20._48_4_ = uVar1;
              auVar20._52_4_ = uVar1;
              auVar20._56_4_ = uVar1;
              auVar20._60_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512f(auVar45,auVar2,auVar20);
              uVar1 = *(undefined4 *)((long)local_d8.data + lVar37 + lVar36 + 0x1c);
              auVar21._4_4_ = uVar1;
              auVar21._0_4_ = uVar1;
              auVar21._8_4_ = uVar1;
              auVar21._12_4_ = uVar1;
              auVar21._16_4_ = uVar1;
              auVar21._20_4_ = uVar1;
              auVar21._24_4_ = uVar1;
              auVar21._28_4_ = uVar1;
              auVar21._32_4_ = uVar1;
              auVar21._36_4_ = uVar1;
              auVar21._40_4_ = uVar1;
              auVar21._44_4_ = uVar1;
              auVar21._48_4_ = uVar1;
              auVar21._52_4_ = uVar1;
              auVar21._56_4_ = uVar1;
              auVar21._60_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512f(auVar46,auVar2,auVar21);
              lVar37 = lVar37 + 0x20;
              iVar38 = iVar38 + -1;
            } while (iVar38 != 0);
          }
          *pauVar27 = auVar39;
          pauVar27[1] = auVar40;
          pauVar27[2] = auVar41;
          pauVar27[3] = auVar42;
          pauVar27[4] = auVar43;
          pauVar27[5] = auVar44;
          pauVar27[6] = auVar45;
          pauVar27[7] = auVar46;
          pauVar27 = pauVar27 + 8;
          uVar30 = uVar33 + 8;
          lVar36 = uVar33 + 0xf;
          lVar23 = lVar23 + 1;
          uVar33 = uVar30;
        } while (lVar36 < (long)uVar24);
      }
      if ((int)uVar30 < (int)uVar3) {
        do {
          auVar46 = *pauVar29;
          if (0 < (int)(_h * iVar4 * 8)) {
            pauVar31 = (undefined1 (*) [64])
                       (kernel->cstep * uVar26 * kernel->elemsize + (long)kernel->data);
            lVar23 = 0;
            do {
              auVar45 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)local_d8.data +
                                                    lVar23 * 4 +
                                                    local_d8.cstep *
                                                    CONCAT44(local_d8.elemsize._4_4_,
                                                             (undefined4)local_d8.elemsize) *
                                                    (ulong)(((uint)uVar30 & 7) +
                                                           ((uint)(uVar30 >> 3) & 0x1fffffff)))));
              auVar46 = vfmadd231ps_avx512f(auVar46,auVar45,*pauVar31);
              pauVar31 = pauVar31 + 1;
              lVar23 = lVar23 + 1;
            } while (iVar34 != (int)lVar23);
          }
          *pauVar27 = auVar46;
          pauVar27 = pauVar27 + 1;
          uVar35 = (uint)uVar30 + 1;
          uVar30 = (ulong)uVar35;
        } while (uVar35 != uVar3);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != local_88);
  }
  piVar22 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 32u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 32u, 8, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    transpose8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 8; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                kptr += 16;
                tmpptr += 8;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);

            outptr0 += 16 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 8; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}